

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_collations.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::PragmaCollateInit(ClientContext *context,TableFunctionInitInput *input)

{
  GlobalTableFunctionState GVar1;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var2;
  pointer prVar3;
  templated_unique_single_t result;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  GlobalTableFunctionState local_80;
  GlobalTableFunctionState *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_48;
  
  local_50._M_head_impl = (GlobalTableFunctionState *)context;
  local_80._vptr_GlobalTableFunctionState = (_func_int **)operator_new(0x28);
  *local_80._vptr_GlobalTableFunctionState = (_func_int *)&PTR__PragmaCollateData_019b3a78;
  local_80._vptr_GlobalTableFunctionState[1] = (_func_int *)0x0;
  local_80._vptr_GlobalTableFunctionState[2] = (_func_int *)0x0;
  local_80._vptr_GlobalTableFunctionState[3] = (_func_int *)0x0;
  local_80._vptr_GlobalTableFunctionState[4] = (_func_int *)0x0;
  Catalog::GetAllSchemas(&local_48,(ClientContext *)input);
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar3 = local_48.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uStack_70 = 0;
      local_78 = &local_80;
      pcStack_60 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/pragma_collations.cpp:32:21)>
                   ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/pragma_collations.cpp:32:21)>
                 ::_M_manager;
      (*(prVar3->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (prVar3->_M_data,input,7,&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      prVar3 = prVar3 + 1;
    } while (prVar3 != local_48.
                       super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  _Var2._M_head_impl = local_50._M_head_impl;
  GVar1._vptr_GlobalTableFunctionState = local_80._vptr_GlobalTableFunctionState;
  local_80._vptr_GlobalTableFunctionState = (_func_int **)0x0;
  (local_50._M_head_impl)->_vptr_GlobalTableFunctionState = GVar1._vptr_GlobalTableFunctionState;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80._vptr_GlobalTableFunctionState != (_func_int **)0x0) {
    (**(code **)(*local_80._vptr_GlobalTableFunctionState + 8))();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )_Var2._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> PragmaCollateInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<PragmaCollateData>();

	auto schemas = Catalog::GetAllSchemas(context);
	for (auto schema : schemas) {
		schema.get().Scan(context, CatalogType::COLLATION_ENTRY,
		                  [&](CatalogEntry &entry) { result->entries.push_back(entry.name); });
	}
	return std::move(result);
}